

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::ResultInfo::hasExpandedExpression(ResultInfo *this)

{
  int iVar1;
  bool bVar2;
  string local_38;
  
  if ((this->m_expr)._M_string_length == 0) {
    bVar2 = false;
  }
  else {
    getExpandedExpressionInternal_abi_cxx11_(&local_38,this);
    if (local_38._M_string_length == (this->m_expr)._M_string_length) {
      if (local_38._M_string_length == 0) {
        bVar2 = false;
      }
      else {
        iVar1 = bcmp(local_38._M_dataplus._M_p,(this->m_expr)._M_dataplus._M_p,
                     local_38._M_string_length);
        bVar2 = iVar1 != 0;
      }
    }
    else {
      bVar2 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar2;
}

Assistant:

Expression<const T&> operator->* ( const T & operand ) {
        Expression<const T&> expr( m_result, operand );
        return expr;
    }